

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall
Js::DiagScopeVariablesWalker::Get
          (DiagScopeVariablesWalker *this,int i,ResolvedObject *pResolvedObject)

{
  Type pIVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  Type *ppIVar5;
  undefined4 *puVar6;
  IDiagObjectModelWalkerBase *pObjWalker;
  int j;
  ResolvedObject *pResolvedObject_local;
  int i_local;
  DiagScopeVariablesWalker *this_local;
  
  if ((-1 < i) && (i < (int)this->diagScopeVarCount)) {
    pResolvedObject_local._4_4_ = i;
    for (pObjWalker._4_4_ = 0;
        iVar4 = JsUtil::
                ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                ::Count(&this->pDiagScopeObjects->
                         super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                       ), pObjWalker._4_4_ < iVar4; pObjWalker._4_4_ = pObjWalker._4_4_ + 1) {
      ppIVar5 = JsUtil::
                List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->pDiagScopeObjects,pObjWalker._4_4_);
      pIVar1 = *ppIVar5;
      iVar4 = (*pIVar1->_vptr_IDiagObjectModelWalkerBase[1])();
      if ((int)pResolvedObject_local._4_4_ < iVar4) {
        iVar4 = (**pIVar1->_vptr_IDiagObjectModelWalkerBase)
                          (pIVar1,(ulong)pResolvedObject_local._4_4_,pResolvedObject);
        return iVar4;
      }
      iVar4 = (*pIVar1->_vptr_IDiagObjectModelWalkerBase[1])();
      pResolvedObject_local._4_4_ = pResolvedObject_local._4_4_ - iVar4;
      if ((int)pResolvedObject_local._4_4_ < 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x405,"(i >=0)","i >=0");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
  }
  return 0;
}

Assistant:

BOOL DiagScopeVariablesWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        if (i >= 0 && i < (int)diagScopeVarCount)
        {
            for (int j = 0; j < pDiagScopeObjects->Count(); j++)
            {
                IDiagObjectModelWalkerBase *pObjWalker = pDiagScopeObjects->Item(j);
                if (i < (int)pObjWalker->GetChildrenCount())
                {
                    return pObjWalker->Get(i, pResolvedObject);
                }
                i -= (int)pObjWalker->GetChildrenCount();
                Assert(i >=0);
            }
        }

        return FALSE;
    }